

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

bool __thiscall CLI::App::_parse_single_config(App *this,ConfigItem *item,size_t level)

{
  bool bVar1;
  config_extras_mode cVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  App *this_00;
  Option *pOVar6;
  ConfigError *__return_storage_ptr__;
  element_type *peVar7;
  string *name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  string local_168;
  string local_148;
  string local_128;
  string local_108 [8];
  string res;
  string local_e0;
  string local_c0;
  Classifier local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Option *local_78;
  Option *op;
  OptionNotFound *anon_var_0;
  bool result;
  string local_50;
  App *local_30;
  App *subcom;
  size_t level_local;
  ConfigItem *item_local;
  App *this_local;
  
  subcom = (App *)level;
  level_local = (size_t)item;
  item_local = (ConfigItem *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&item->parents);
  if (level < sVar4) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)level_local,(size_type)subcom);
    ::std::__cxx11::string::string((string *)&local_50,(string *)pvVar5);
    this_00 = get_subcommand(this,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    local_30 = this_00;
    this_local._7_1_ =
         _parse_single_config
                   (this_00,(ConfigItem *)level_local,(size_t)((long)&subcom->_vptr_App + 1));
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (level_local + 0x18),"++");
    if (bVar1) {
      if ((this->configurable_ & 1U) != 0) {
        increment_parsed(this);
        _trigger_pre_parse(this,2);
        if (this->parent_ != (App *)0x0) {
          op = (Option *)this;
          std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                    (&this->parent_->parsed_subcommands_,(value_type *)&op);
        }
      }
      this_local._7_1_ = true;
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(level_local + 0x18),"--");
      if (bVar1) {
        if ((this->configurable_ & 1U) != 0) {
          _process_callbacks(this);
          _process_requirements(this);
          run_callback(this,false);
        }
        this_local._7_1_ = true;
      }
      else {
        ::std::operator+(&local_98,"--",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (level_local + 0x18));
        pOVar6 = get_option_no_throw(this,&local_98);
        ::std::__cxx11::string::~string((string *)&local_98);
        local_78 = pOVar6;
        if (pOVar6 == (Option *)0x0) {
          cVar2 = get_allow_config_extras(this);
          if (cVar2 == capture) {
            local_9c = NONE;
            ConfigItem::fullname_abi_cxx11_(&local_c0,(ConfigItem *)level_local);
            ::std::
            vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
            ::emplace_back<CLI::detail::Classifier,std::__cxx11::string>
                      ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                        *)&this->missing_,&local_9c,&local_c0);
            ::std::__cxx11::string::~string((string *)&local_c0);
          }
          this_local._7_1_ = false;
        }
        else {
          bVar1 = OptionBase<CLI::Option>::get_configurable(&pOVar6->super_OptionBase<CLI::Option>);
          if (!bVar1) {
            res.field_2._M_local_buf[0xf] = '\x01';
            __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
            ConfigItem::fullname_abi_cxx11_(&local_e0,(ConfigItem *)level_local);
            ConfigError::NotConfigurable(__return_storage_ptr__,&local_e0);
            res.field_2._M_local_buf[0xf] = '\0';
            __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,ConfigError::~ConfigError);
          }
          bVar1 = Option::empty(local_78);
          if (bVar1) {
            iVar3 = Option::get_expected_min(local_78);
            pOVar6 = local_78;
            if (iVar3 == 0) {
              peVar7 = std::
                       __shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->config_formatter_);
              (*peVar7->_vptr_Config[2])(local_108,peVar7,level_local);
              pOVar6 = local_78;
              name = (string *)(level_local + 0x18);
              ::std::__cxx11::string::string((string *)&local_148,local_108);
              Option::get_flag_value(&local_128,pOVar6,name,&local_148);
              ::std::__cxx11::string::operator=(local_108,(string *)&local_128);
              ::std::__cxx11::string::~string((string *)&local_128);
              ::std::__cxx11::string::~string((string *)&local_148);
              pOVar6 = local_78;
              ::std::__cxx11::string::string((string *)&local_168,local_108);
              Option::add_result(pOVar6,&local_168);
              ::std::__cxx11::string::~string((string *)&local_168);
              ::std::__cxx11::string::~string(local_108);
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_180,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(level_local + 0x38));
              Option::add_result(pOVar6,&local_180);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_180);
              Option::run_callback(local_78);
            }
          }
          this_local._7_1_ = true;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool _parse_single_config(const ConfigItem &item, std::size_t level = 0) {
        if(level < item.parents.size()) {
            try {
                auto subcom = get_subcommand(item.parents.at(level));
                auto result = subcom->_parse_single_config(item, level + 1);

                return result;
            } catch(const OptionNotFound &) {
                return false;
            }
        }
        // check for section open
        if(item.name == "++") {
            if(configurable_) {
                increment_parsed();
                _trigger_pre_parse(2);
                if(parent_ != nullptr) {
                    parent_->parsed_subcommands_.push_back(this);
                }
            }
            return true;
        }
        // check for section close
        if(item.name == "--") {
            if(configurable_) {
                _process_callbacks();
                _process_requirements();
                run_callback();
            }
            return true;
        }
        Option *op = get_option_no_throw("--" + item.name);
        if(op == nullptr) {
            // If the option was not present
            if(get_allow_config_extras() == config_extras_mode::capture)
                // Should we worry about classifying the extras properly?
                missing_.emplace_back(detail::Classifier::NONE, item.fullname());
            return false;
        }

        if(!op->get_configurable())
            throw ConfigError::NotConfigurable(item.fullname());

        if(op->empty()) {
            // Flag parsing
            if(op->get_expected_min() == 0) {
                auto res = config_formatter_->to_flag(item);
                res = op->get_flag_value(item.name, res);

                op->add_result(res);

            } else {
                op->add_result(item.inputs);
                op->run_callback();
            }
        }

        return true;
    }